

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionList.cpp
# Opt level: O0

void __thiscall curlpp::internal::OptionList::setOpt(OptionList *this,OptionList *options)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  long *in_RDI;
  const_iterator pos;
  map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Self in_stack_ffffffffffffffd8;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(local_18,&local_20);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>
                         *)0x14f54d);
    iVar2 = (*ppVar3->second->_vptr_OptionBase[3])();
    (**(code **)(*in_RDI + 0x10))(in_RDI,iVar2);
    in_stack_ffffffffffffffd8 =
         std::_Rb_tree_const_iterator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>::
         operator++(in_stack_ffffffffffffffd8._M_node,(int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void OptionList::setOpt(const OptionList & options)
{
  for(mapType::const_iterator pos = options.mOptions.begin();
      pos != options.mOptions.end();
      pos++)
   {
     setOpt(pos->second->clone());
   }  
}